

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_from_storage(secp256k1_ge *r,secp256k1_ge_storage *a)

{
  (r->x).n[0] = (a->x).n[0] & 0xfffffffffffff;
  (r->x).n[1] = ((a->x).n[1] & 0xffffffffff) << 0xc | (a->x).n[0] >> 0x34;
  (r->x).n[2] = ((a->x).n[2] & 0xfffffff) << 0x18 | (a->x).n[1] >> 0x28;
  (r->x).n[3] = ((a->x).n[3] & 0xffff) << 0x24 | (a->x).n[2] >> 0x1c;
  (r->x).n[4] = (a->x).n[3] >> 0x10;
  (r->x).magnitude = 1;
  (r->x).normalized = 1;
  secp256k1_fe_verify(&r->x);
  (r->y).n[0] = (a->y).n[0] & 0xfffffffffffff;
  (r->y).n[1] = ((a->y).n[1] & 0xffffffffff) << 0xc | (a->y).n[0] >> 0x34;
  (r->y).n[2] = ((a->y).n[2] & 0xfffffff) << 0x18 | (a->y).n[1] >> 0x28;
  (r->y).n[3] = ((a->y).n[3] & 0xffff) << 0x24 | (a->y).n[2] >> 0x1c;
  (r->y).n[4] = (a->y).n[3] >> 0x10;
  (r->y).magnitude = 1;
  (r->y).normalized = 1;
  secp256k1_fe_verify(&r->y);
  r->infinity = 0;
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_from_storage(secp256k1_ge *r, const secp256k1_ge_storage *a) {
    secp256k1_fe_from_storage(&r->x, &a->x);
    secp256k1_fe_from_storage(&r->y, &a->y);
    r->infinity = 0;

    SECP256K1_GE_VERIFY(r);
}